

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::UniformCase::writeUniformDefinitions(UniformCase *this,ostringstream *dst)

{
  int iVar1;
  char *__s;
  UniformCase *pUVar2;
  bool bVar3;
  pointer ppSVar4;
  ostream *poVar5;
  StructType *pSVar6;
  size_t sVar7;
  UniformCollection *pUVar8;
  anon_struct_8_2_bfd9d0cb_for_basic aVar9;
  uint uVar10;
  DataType DVar11;
  pointer pUVar12;
  int compFuncNdx;
  long lVar13;
  long lVar14;
  vector<glu::DataType,_std::allocator<glu::DataType>_> samplerTypes;
  allocator<char> local_99;
  undefined1 local_98 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  UniformCase *local_58;
  string local_50;
  
  pUVar8 = (this->m_uniformCollection).m_ptr;
  ppSVar4 = (pUVar8->m_structTypes).
            super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(pUVar8->m_structTypes).
                              super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar4) >> 3)) {
    lVar13 = 0;
    do {
      local_98._0_8_ = ppSVar4[lVar13];
      local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
      poVar5 = glu::decl::operator<<
                         (&dst->super_basic_ostream<char,_std::char_traits<char>_>,
                          (DeclareStructTypePtr *)local_98);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,";\n",2);
      lVar13 = lVar13 + 1;
      pUVar8 = (this->m_uniformCollection).m_ptr;
      ppSVar4 = (pUVar8->m_structTypes).
                super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar13 < (int)((ulong)((long)(pUVar8->m_structTypes).
                                          super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar4
                                   ) >> 3));
  }
  if (0 < (int)((ulong)((long)(pUVar8->m_uniforms).
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pUVar8->m_uniforms).
                             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249) {
    lVar14 = 0x20;
    lVar13 = 0;
    local_58 = this;
    do {
      pUVar2 = local_58;
      std::__ostream_insert<char,std::char_traits<char>>
                (&dst->super_basic_ostream<char,_std::char_traits<char>_>,"uniform ",8);
      pUVar12 = (((pUVar2->m_uniformCollection).m_ptr)->m_uniforms).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
                ._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,*(char **)((long)pUVar12 + lVar14 + -0x20),&local_99);
      glu::decl::DeclareVariable::DeclareVariable
                ((DeclareVariable *)local_98,(VarType *)((long)&pUVar12->name + lVar14),&local_50,0)
      ;
      poVar5 = glu::decl::operator<<
                         (&dst->super_basic_ostream<char,_std::char_traits<char>_>,
                          (DeclareVariable *)local_98);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,";\n",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._24_8_ != &local_70) {
        operator_delete((void *)local_98._24_8_,local_70._M_allocated_capacity + 1);
      }
      glu::VarType::~VarType((VarType *)local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      lVar13 = lVar13 + 1;
      pUVar8 = (local_58->m_uniformCollection).m_ptr;
      lVar14 = lVar14 + 0x38;
      this = local_58;
    } while (lVar13 < (int)((ulong)((long)(pUVar8->m_uniforms).
                                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pUVar8->m_uniforms).
                                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                      -0x49249249);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (&dst->super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
  pUVar8 = (this->m_uniformCollection).m_ptr;
  local_98._0_8_ = (StructType *)0x0;
  local_98._8_8_ = (VarType *)0x0;
  local_98._16_8_ = 0;
  pUVar12 = (pUVar8->m_uniforms).
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(pUVar8->m_uniforms).
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar12) >> 3) *
          -0x49249249) {
    lVar14 = 0x20;
    lVar13 = 0;
    do {
      getDistinctSamplerTypes
                ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_98,
                 (VarType *)((long)&pUVar12->name + lVar14));
      lVar13 = lVar13 + 1;
      pUVar12 = (pUVar8->m_uniforms).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar14 = lVar14 + 0x38;
    } while (lVar13 < (int)((ulong)((long)(pUVar8->m_uniforms).
                                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar12
                                   ) >> 3) * -0x49249249);
  }
  lVar13 = 0;
  do {
    if (0 < (int)((ulong)(local_98._8_8_ - local_98._0_8_) >> 2)) {
      lVar14 = 0;
      pSVar6 = (StructType *)local_98._0_8_;
      aVar9 = (anon_struct_8_2_bfd9d0cb_for_basic)local_98._8_8_;
      do {
        iVar1 = *(int *)((long)&pSVar6->m_typeName + lVar14 * 4);
        if (iVar1 - 0x27U < 0x1e) {
          uVar10 = iVar1 - 0x28;
          DVar11 = TYPE_LAST;
          if (uVar10 < 0x19) {
            DVar11 = *(DataType *)(&DAT_01c661a8 + (ulong)uVar10 * 4);
          }
          bVar3 = (*writeUniformDefinitions::compareFuncs[lVar13].requiringTypes[0])(DVar11);
          if ((bVar3) ||
             (bVar3 = (*writeUniformDefinitions::compareFuncs[lVar13].requiringTypes[1])(DVar11),
             pSVar6 = (StructType *)local_98._0_8_,
             aVar9 = (anon_struct_8_2_bfd9d0cb_for_basic)local_98._8_8_, bVar3)) goto LAB_0154125a;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < (int)((ulong)((long)aVar9 - (long)pSVar6) >> 2));
    }
    bVar3 = anon_unknown_1::UniformCollection::containsMatchingBasicType
                      ((this->m_uniformCollection).m_ptr,
                       writeUniformDefinitions::compareFuncs[lVar13].requiringTypes[0]);
    if ((bVar3) ||
       (bVar3 = anon_unknown_1::UniformCollection::containsMatchingBasicType
                          ((this->m_uniformCollection).m_ptr,
                           writeUniformDefinitions::compareFuncs[lVar13].requiringTypes[1]), bVar3))
    {
LAB_0154125a:
      __s = writeUniformDefinitions::compareFuncs[lVar13].definition;
      if (__s == (char *)0x0) {
        std::ios::clear((int)dst +
                        (int)(dst->super_basic_ostream<char,_std::char_traits<char>_>).
                             _vptr_basic_ostream[-3]);
      }
      else {
        sVar7 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&dst->super_basic_ostream<char,_std::char_traits<char>_>,__s,sVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (&dst->super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
    }
    lVar13 = lVar13 + 1;
    if (lVar13 == 0x19) {
      if ((StructType *)local_98._0_8_ != (StructType *)0x0) {
        operator_delete((void *)local_98._0_8_,local_98._16_8_ - local_98._0_8_);
      }
      return;
    }
  } while( true );
}

Assistant:

void UniformCase::writeUniformDefinitions (std::ostringstream& dst) const
{
	for (int i = 0; i < (int)m_uniformCollection->getNumStructTypes(); i++)
		dst << glu::declare(m_uniformCollection->getStructType(i)) << ";\n";

	for (int i = 0; i < (int)m_uniformCollection->getNumUniforms(); i++)
		dst << "uniform " << glu::declare(m_uniformCollection->getUniform(i).type, m_uniformCollection->getUniform(i).name.c_str()) << ";\n";

	dst << "\n";

	{
		static const struct
		{
			dataTypePredicate	requiringTypes[2];
			const char*			definition;
		} compareFuncs[] =
		{
			{ { glu::isDataTypeFloatOrVec,				glu::isDataTypeMatrix				}, "mediump float compare_float    (mediump float a, mediump float b)  { return abs(a - b) < 0.05 ? 1.0 : 0.0; }"																		},
			{ { dataTypeEquals<glu::TYPE_FLOAT_VEC2>,	dataTypeIsMatrixWithNRows<2>		}, "mediump float compare_vec2     (mediump vec2 a, mediump vec2 b)    { return compare_float(a.x, b.x)*compare_float(a.y, b.y); }"														},
			{ { dataTypeEquals<glu::TYPE_FLOAT_VEC3>,	dataTypeIsMatrixWithNRows<3>		}, "mediump float compare_vec3     (mediump vec3 a, mediump vec3 b)    { return compare_float(a.x, b.x)*compare_float(a.y, b.y)*compare_float(a.z, b.z); }"								},
			{ { dataTypeEquals<glu::TYPE_FLOAT_VEC4>,	dataTypeIsMatrixWithNRows<4>		}, "mediump float compare_vec4     (mediump vec4 a, mediump vec4 b)    { return compare_float(a.x, b.x)*compare_float(a.y, b.y)*compare_float(a.z, b.z)*compare_float(a.w, b.w); }"		},
			{ { dataTypeEquals<glu::TYPE_FLOAT_MAT2>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_mat2     (mediump mat2 a, mediump mat2 b)    { return compare_vec2(a[0], b[0])*compare_vec2(a[1], b[1]); }"													},
			{ { dataTypeEquals<glu::TYPE_FLOAT_MAT2X3>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_mat2x3   (mediump mat2x3 a, mediump mat2x3 b){ return compare_vec3(a[0], b[0])*compare_vec3(a[1], b[1]); }"													},
			{ { dataTypeEquals<glu::TYPE_FLOAT_MAT2X4>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_mat2x4   (mediump mat2x4 a, mediump mat2x4 b){ return compare_vec4(a[0], b[0])*compare_vec4(a[1], b[1]); }"													},
			{ { dataTypeEquals<glu::TYPE_FLOAT_MAT3X2>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_mat3x2   (mediump mat3x2 a, mediump mat3x2 b){ return compare_vec2(a[0], b[0])*compare_vec2(a[1], b[1])*compare_vec2(a[2], b[2]); }"							},
			{ { dataTypeEquals<glu::TYPE_FLOAT_MAT3>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_mat3     (mediump mat3 a, mediump mat3 b)    { return compare_vec3(a[0], b[0])*compare_vec3(a[1], b[1])*compare_vec3(a[2], b[2]); }"							},
			{ { dataTypeEquals<glu::TYPE_FLOAT_MAT3X4>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_mat3x4   (mediump mat3x4 a, mediump mat3x4 b){ return compare_vec4(a[0], b[0])*compare_vec4(a[1], b[1])*compare_vec4(a[2], b[2]); }"							},
			{ { dataTypeEquals<glu::TYPE_FLOAT_MAT4X2>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_mat4x2   (mediump mat4x2 a, mediump mat4x2 b){ return compare_vec2(a[0], b[0])*compare_vec2(a[1], b[1])*compare_vec2(a[2], b[2])*compare_vec2(a[3], b[3]); }"	},
			{ { dataTypeEquals<glu::TYPE_FLOAT_MAT4X3>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_mat4x3   (mediump mat4x3 a, mediump mat4x3 b){ return compare_vec3(a[0], b[0])*compare_vec3(a[1], b[1])*compare_vec3(a[2], b[2])*compare_vec3(a[3], b[3]); }"	},
			{ { dataTypeEquals<glu::TYPE_FLOAT_MAT4>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_mat4     (mediump mat4 a, mediump mat4 b)    { return compare_vec4(a[0], b[0])*compare_vec4(a[1], b[1])*compare_vec4(a[2], b[2])*compare_vec4(a[3], b[3]); }"	},
			{ { dataTypeEquals<glu::TYPE_INT>,			dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_int      (mediump int a, mediump int b)      { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_INT_VEC2>,		dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_ivec2    (mediump ivec2 a, mediump ivec2 b)  { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_INT_VEC3>,		dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_ivec3    (mediump ivec3 a, mediump ivec3 b)  { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_INT_VEC4>,		dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_ivec4    (mediump ivec4 a, mediump ivec4 b)  { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_UINT>,			dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_uint     (mediump uint a, mediump uint b)    { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_UINT_VEC2>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_uvec2    (mediump uvec2 a, mediump uvec2 b)  { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_UINT_VEC3>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_uvec3    (mediump uvec3 a, mediump uvec3 b)  { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_UINT_VEC4>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_uvec4    (mediump uvec4 a, mediump uvec4 b)  { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_BOOL>,			dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_bool     (bool a, bool b)                    { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_BOOL_VEC2>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_bvec2    (bvec2 a, bvec2 b)                  { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_BOOL_VEC3>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_bvec3    (bvec3 a, bvec3 b)                  { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_BOOL_VEC4>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_bvec4    (bvec4 a, bvec4 b)                  { return a == b ? 1.0 : 0.0; }"																					}
		};

		const vector<glu::DataType> samplerTypes = m_uniformCollection->getSamplerTypes();

		for (int compFuncNdx = 0; compFuncNdx < DE_LENGTH_OF_ARRAY(compareFuncs); compFuncNdx++)
		{
			const dataTypePredicate		(&typeReq)[2]			= compareFuncs[compFuncNdx].requiringTypes;
			bool						containsTypeSampler		= false;

			for (int i = 0; i < (int)samplerTypes.size(); i++)
			{
				if (glu::isDataTypeSampler(samplerTypes[i]))
				{
					const glu::DataType retType = getSamplerLookupReturnType(samplerTypes[i]);
					if (typeReq[0](retType) || typeReq[1](retType))
					{
						containsTypeSampler = true;
						break;
					}
				}
			}

			if (containsTypeSampler || m_uniformCollection->containsMatchingBasicType(typeReq[0]) || m_uniformCollection->containsMatchingBasicType(typeReq[1]))
				dst << compareFuncs[compFuncNdx].definition << "\n";
		}
	}
}